

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::SSARewritePass::Process(SSARewritePass *this)

{
  uint32_t variable_id;
  bool bVar1;
  Status b;
  Module *this_00;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_01;
  reference puVar2;
  IRContext *this_02;
  DebugInfoManager *this_03;
  _Node_iterator_base<unsigned_int,_false> _Stack_1b0;
  uint var_id;
  iterator __end3;
  iterator __begin3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range3;
  reference local_48;
  value_type *fn;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  Status status;
  SSARewritePass *this_local;
  
  __range2._4_4_ = SuccessWithoutChange;
  this_00 = Pass::get_module((Pass *)this);
  join_0x00000010_0x00000000_ = Module::begin(this_00);
  _fn = Module::end(this_00);
  do {
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::Function,_false> *)&fn);
    if (!bVar1) {
      return __range2._4_4_;
    }
    local_48 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    bVar1 = opt::Function::IsDeclaration(local_48);
    if (!bVar1) {
      SSARewriter::SSARewriter((SSARewriter *)&__range3,&this->super_MemPass);
      b = SSARewriter::RewriteFunctionIntoSSA((SSARewriter *)&__range3,local_48);
      __range2._4_4_ = CombineStatus(__range2._4_4_,b);
      SSARewriter::~SSARewriter((SSARewriter *)&__range3);
      this_01 = &(this->super_MemPass).seen_target_vars_;
      __end3 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)this_01);
      _Stack_1b0._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)this_01);
      while (bVar1 = std::__detail::operator!=
                               (&__end3.super__Node_iterator_base<unsigned_int,_false>,
                                &stack0xfffffffffffffe50), bVar1) {
        puVar2 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end3);
        variable_id = *puVar2;
        this_02 = Pass::context((Pass *)this);
        this_03 = IRContext::get_debug_info_mgr(this_02);
        analysis::DebugInfoManager::KillDebugDeclares(this_03,variable_id);
        std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end3);
      }
      if (__range2._4_4_ == Failure) {
        return Failure;
      }
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  } while( true );
}

Assistant:

Pass::Status SSARewritePass::Process() {
  Status status = Status::SuccessWithoutChange;
  for (auto& fn : *get_module()) {
    if (fn.IsDeclaration()) {
      continue;
    }
    status =
        CombineStatus(status, SSARewriter(this).RewriteFunctionIntoSSA(&fn));
    // Kill DebugDeclares for target variables.
    for (auto var_id : seen_target_vars_) {
      context()->get_debug_info_mgr()->KillDebugDeclares(var_id);
    }
    if (status == Status::Failure) {
      break;
    }
  }
  return status;
}